

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.cpp
# Opt level: O2

string * infoEntryTypeToString_abi_cxx11_(string *__return_storage_ptr__,HighsInfoType type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (type == kInt) {
    pcVar2 = "HighsInt";
    paVar1 = &local_a;
  }
  else if (type == kInt64) {
    pcVar2 = "int64_t";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "double";
    paVar1 = &local_b;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

static std::string infoEntryTypeToString(const HighsInfoType type) {
  if (type == HighsInfoType::kInt64) {
    return "int64_t";
  } else if (type == HighsInfoType::kInt) {
    return "HighsInt";
  } else {
    return "double";
  }
}